

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

Color __thiscall
Renderer::renderPixel
          (Renderer *this,function<vec3f_(Ray,_Sampler_&)> *func,vec2f *pixelpos,vec2f *pixelsize)

{
  undefined1 auVar1 [16];
  int iVar2;
  Sampler *pSVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  result_type rVar7;
  _func_int **pp_Var8;
  int iVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [16];
  float fVar11;
  vec3f vVar12;
  Color CVar13;
  Ray ray;
  float local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  point local_70 [2];
  undefined1 local_58 [16];
  Ray local_48;
  
  iVar2 = this->nspp;
  if (iVar2 < 1) {
    local_98 = 0.0;
    fStack_94 = 0.0;
    fStack_90 = 0.0;
    fStack_8c = 0.0;
    local_9c = 0.0;
  }
  else {
    local_98 = 0.0;
    fStack_94 = 0.0;
    fStack_90 = 0.0;
    fStack_8c = 0.0;
    local_9c = 0.0;
    iVar9 = 0;
    do {
      pSVar3 = (Sampler *)operator_new(0x1390);
      sVar4 = std::hash<float>::operator()((hash<float> *)&local_48,pixelpos->x);
      sVar5 = std::hash<float>::operator()((hash<float> *)local_70,PI * pixelpos->y);
      pSVar3->_vptr_Sampler = (_func_int **)&PTR_get1f_0016bb78;
      pp_Var8 = (_func_int **)(ulong)(iVar9 * 2 ^ (int)sVar4 << 2 ^ (uint)sVar5);
      pSVar3[1]._vptr_Sampler = pp_Var8;
      lVar6 = 2;
      do {
        pp_Var8 = (_func_int **)
                  (ulong)((((uint)((ulong)pp_Var8 >> 0x1e) ^ (uint)pp_Var8) * 0x6c078965 +
                          (int)lVar6) - 1);
        pSVar3[lVar6]._vptr_Sampler = pp_Var8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x271);
      pSVar3[0x271]._vptr_Sampler = (_func_int **)0x270;
      rVar7 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)(pSVar3 + 1));
      local_58 = ZEXT416((uint)((float)rVar7 * 2.3283064e-10));
      (**pSVar3->_vptr_Sampler)(pSVar3);
      (**this->camera->_vptr_Camera)(local_70,this->camera,pSVar3);
      local_48.dir.y = local_70[1].y;
      local_48.dir.z = local_70[1].z;
      local_48.origin.x = local_70[0].x;
      local_48.origin.y = local_70[0].y;
      local_48.origin.z = local_70[0].z;
      local_48.dir.x = local_70[1].x;
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      vVar12 = (*func->_M_invoker)((_Any_data *)func,&local_48,pSVar3);
      local_98 = local_98 + vVar12.x;
      fStack_94 = fStack_94 + vVar12.y;
      fStack_90 = fStack_90 + (float)extraout_XMM0_Qb;
      fStack_8c = fStack_8c + (float)((ulong)extraout_XMM0_Qb >> 0x20);
      local_9c = local_9c + vVar12.z;
      operator_delete(pSVar3,8);
      iVar9 = iVar9 + 1;
      iVar2 = this->nspp;
    } while (iVar9 < iVar2);
  }
  fVar11 = (float)iVar2;
  CVar13.z = local_9c / fVar11;
  auVar1._4_4_ = fStack_94;
  auVar1._0_4_ = local_98;
  auVar1._8_4_ = fStack_90;
  auVar1._12_4_ = fStack_8c;
  auVar10._4_4_ = fVar11;
  auVar10._0_4_ = fVar11;
  auVar10._8_4_ = fVar11;
  auVar10._12_4_ = fVar11;
  auVar10 = divps(auVar1,auVar10);
  CVar13._0_8_ = auVar10._0_8_;
  return CVar13;
}

Assistant:

Color Renderer::renderPixel(std::function<Color(Ray, Sampler&)> func, const vec2f& pixelpos, const vec2f& pixelsize) {
	Color res;
	for (int i=0; i<nspp; ++i) {
		Sampler* sampler = new MT19937Sampler((std::hash<float>{}(pixelpos.x)<<2)^std::hash<float>{}(PI*pixelpos.y), i);
		vec2f uv = pixelpos + sampler->get2f() * pixelsize;
		Ray ray = camera->sampleray(uv, *sampler);
		Color tres = func(ray, *sampler);
		/*if (norm(tres)<1e8)*/ res += tres;
		delete sampler;
	}
	return res / nspp;
}